

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

Marray<float,_std::allocator<unsigned_long>_> * __thiscall
andres::Marray<float,_std::allocator<unsigned_long>_>::operator=
          (Marray<float,_std::allocator<unsigned_long>_> *this,
          Marray<float,_std::allocator<unsigned_long>_> *in)

{
  size_t sVar1;
  float *pfVar2;
  unsigned_long *puVar3;
  runtime_error *this_00;
  
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            (&this->super_View<float,_false,_std::allocator<unsigned_long>_>);
  if ((this->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.isSimple_ == false)
  {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
              (&in->super_View<float,_false,_std::allocator<unsigned_long>_>);
    if ((in->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.isSimple_ == false)
    {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
    else {
      if (this != in) {
        if ((in->super_View<float,_false,_std::allocator<unsigned_long>_>).data_ == (pointer)0x0) {
          operator_delete((this->super_View<float,_false,_std::allocator<unsigned_long>_>).data_,
                          (this->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_
                          .size_ << 2);
          (this->super_View<float,_false,_std::allocator<unsigned_long>_>).data_ = (pointer)0x0;
        }
        else {
          sVar1 = (this->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.size_;
          if (sVar1 != (in->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.
                       size_) {
            operator_delete((this->super_View<float,_false,_std::allocator<unsigned_long>_>).data_,
                            sVar1 << 2);
            pfVar2 = __gnu_cxx::new_allocator<float>::allocate
                               ((new_allocator<float> *)&this->field_0x40,
                                (in->super_View<float,_false,_std::allocator<unsigned_long>_>).
                                geometry_.size_,(void *)0x0);
            (this->super_View<float,_false,_std::allocator<unsigned_long>_>).data_ = pfVar2;
          }
          memcpy((this->super_View<float,_false,_std::allocator<unsigned_long>_>).data_,
                 (in->super_View<float,_false,_std::allocator<unsigned_long>_>).data_,
                 (in->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.size_ << 2
                );
        }
        if (in != this) {
          sVar1 = (this->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.
                  dimension_;
          if ((in->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.dimension_ !=
              sVar1) {
            operator_delete((this->super_View<float,_false,_std::allocator<unsigned_long>_>).
                            geometry_.shape_,sVar1 * 0x18);
            sVar1 = (in->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.
                    dimension_;
            (this->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.dimension_ =
                 sVar1;
            puVar3 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                               ((new_allocator<unsigned_long> *)
                                &(this->super_View<float,_false,_std::allocator<unsigned_long>_>).
                                 geometry_,sVar1 * 3,(void *)0x0);
            (this->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.shape_ =
                 puVar3;
            sVar1 = (this->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.
                    dimension_;
            (this->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.shapeStrides_
                 = puVar3 + sVar1;
            (this->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.strides_ =
                 puVar3 + sVar1 + sVar1;
            (this->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.dimension_ =
                 (in->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.dimension_
            ;
          }
          memcpy((this->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.shape_,
                 (in->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.shape_,
                 (this->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.
                 dimension_ * 0x18);
          (this->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.size_ =
               (in->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.size_;
          (this->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.
          coordinateOrder_ =
               (in->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.
               coordinateOrder_;
          (this->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.isSimple_ =
               (in->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.isSimple_;
        }
      }
      View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
                (&this->super_View<float,_false,_std::allocator<unsigned_long>_>);
      if ((this->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.isSimple_ !=
          false) {
        return this;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Marray<T, A>&
Marray<T, A>::operator=
(
    const Marray<T, A>& in
)
{
    testInvariant();
    if(!MARRAY_NO_ARG_TEST) {
        in.testInvariant();
    }
    if(this != &in) { // no self-assignment
        // copy data
        if(in.data_ == 0) { // un-initialized
            // free
            dataAllocator_.deallocate(this->data_, this->size());
            this->data_ = 0;
        }
        else {
            if(this->size() != in.size()) {
                // re-alloc
                dataAllocator_.deallocate(this->data_, this->size());
                this->data_ = dataAllocator_.allocate(in.size());
            }
            // copy data
            memcpy(this->data_, in.data_, in.size() * sizeof(T));
        }
        this->geometry_ = in.geometry_;
    }
    testInvariant();
    return *this;
}